

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jerror.c
# Opt level: O2

void format_message(j_common_ptr cinfo,char *buffer)

{
  char cVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  char *pcVar4;
  char **ppcVar5;
  char *__format;
  
  pjVar3 = cinfo->err;
  iVar2 = pjVar3->msg_code;
  if (((long)iVar2 < 1) || (pjVar3->last_jpeg_message < iVar2)) {
    if ((pjVar3->addon_message_table != (char **)0x0) &&
       ((pjVar3->first_addon_message <= iVar2 && (iVar2 <= pjVar3->last_addon_message)))) {
      ppcVar5 = pjVar3->addon_message_table + (iVar2 - pjVar3->first_addon_message);
      goto LAB_00111736;
    }
  }
  else {
    ppcVar5 = pjVar3->jpeg_message_table + iVar2;
LAB_00111736:
    pcVar4 = *ppcVar5;
    __format = pcVar4;
    if (pcVar4 != (char *)0x0) goto LAB_0011174e;
  }
  (pjVar3->msg_parm).i[0] = iVar2;
  pcVar4 = *pjVar3->jpeg_message_table;
  __format = pcVar4;
LAB_0011174e:
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '\0') goto LAB_00111775;
    pcVar4 = pcVar4 + 1;
  } while (cVar1 != '%');
  if (*pcVar4 == 's') {
    sprintf(buffer,__format,&pjVar3->msg_parm);
    return;
  }
LAB_00111775:
  sprintf(buffer,__format,(ulong)(uint)(pjVar3->msg_parm).i[0],(ulong)(uint)(pjVar3->msg_parm).i[1],
          (ulong)(uint)(pjVar3->msg_parm).i[2],(ulong)(uint)(pjVar3->msg_parm).i[3],
          (ulong)(uint)(pjVar3->msg_parm).i[4],(ulong)(uint)(pjVar3->msg_parm).i[5],
          (ulong)(uint)(pjVar3->msg_parm).i[6],(ulong)(uint)(pjVar3->msg_parm).i[7]);
  return;
}

Assistant:

METHODDEF(void)
format_message(j_common_ptr cinfo, char *buffer)
{
  struct jpeg_error_mgr *err = cinfo->err;
  int msg_code = err->msg_code;
  const char *msgtext = NULL;
  const char *msgptr;
  char ch;
  boolean isstring;

  /* Look up message string in proper table */
  if (msg_code > 0 && msg_code <= err->last_jpeg_message) {
    msgtext = err->jpeg_message_table[msg_code];
  } else if (err->addon_message_table != NULL &&
             msg_code >= err->first_addon_message &&
             msg_code <= err->last_addon_message) {
    msgtext = err->addon_message_table[msg_code - err->first_addon_message];
  }

  /* Defend against bogus message number */
  if (msgtext == NULL) {
    err->msg_parm.i[0] = msg_code;
    msgtext = err->jpeg_message_table[0];
  }

  /* Check for string parameter, as indicated by %s in the message text */
  isstring = FALSE;
  msgptr = msgtext;
  while ((ch = *msgptr++) != '\0') {
    if (ch == '%') {
      if (*msgptr == 's') isstring = TRUE;
      break;
    }
  }

  /* Format the message into the passed buffer */
  if (isstring)
    sprintf(buffer, msgtext, err->msg_parm.s);
  else
    sprintf(buffer, msgtext,
            err->msg_parm.i[0], err->msg_parm.i[1],
            err->msg_parm.i[2], err->msg_parm.i[3],
            err->msg_parm.i[4], err->msg_parm.i[5],
            err->msg_parm.i[6], err->msg_parm.i[7]);
}